

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall nuraft::asio_rpc_client::set_busy_flag(asio_rpc_client *this,bool to)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte in_SIL;
  long in_RDI;
  bool exp_1;
  bool exp;
  string local_60 [24];
  memory_order in_stack_ffffffffffffffb8;
  bool in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  atomic<bool> *in_stack_ffffffffffffffc8;
  string local_30 [38];
  undefined1 local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (local_9 == 1) {
    local_a = 0;
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      (in_stack_ffffffffffffffc8,
                       (bool *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8);
    if ((!bVar1) &&
       (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x310)), bVar1))
    {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3e077b);
      iVar2 = (**(code **)(*(long *)peVar3 + 0x38))();
      if (0 < iVar2) {
        peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3e079e);
        uVar4 = std::__cxx11::string::c_str();
        uVar5 = std::__cxx11::string::c_str();
        msg_if_given_abi_cxx11_
                  ((char *)local_30,
                   "socket %p is already in use, race happened on connection to %s:%s",in_RDI,uVar4,
                   uVar5);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"set_busy_flag",0x4f4,local_30);
        std::__cxx11::string::~string(local_30);
      }
    }
  }
  else {
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      (in_stack_ffffffffffffffc8,
                       (bool *)CONCAT44(in_stack_ffffffffffffffc4,
                                        CONCAT13(1,(int3)in_stack_ffffffffffffffc0)),
                       in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8);
    if ((!bVar1) &&
       (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x310)), bVar1))
    {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3e08a2);
      iVar2 = (**(code **)(*(long *)peVar3 + 0x38))();
      if (0 < iVar2) {
        peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3e08c5);
        uVar4 = std::__cxx11::string::c_str();
        uVar5 = std::__cxx11::string::c_str();
        msg_if_given_abi_cxx11_
                  ((char *)local_60,
                   "socket %p is already idle, race happened on connection to %s:%s",in_RDI,uVar4,
                   uVar5);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"set_busy_flag",0x4fb,local_60);
        std::__cxx11::string::~string(local_60);
      }
    }
  }
  return;
}

Assistant:

void set_busy_flag(bool to) {
        if (to == true) {
            bool exp = false;
            if (!socket_busy_.compare_exchange_strong(exp, true)) {
                p_ft("socket %p is already in use, race happened on connection to %s:%s",
                     this, host_.c_str(), port_.c_str());
                assert(0);
            }
        } else {
            bool exp = true;
            if (!socket_busy_.compare_exchange_strong(exp, false)) {
                p_ft("socket %p is already idle, race happened on connection to %s:%s",
                     this, host_.c_str(), port_.c_str());
                assert(0);
            }
        }
    }